

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dofhandler.cc
# Opt level: O3

span<const_long,_18446744073709551615UL> __thiscall
lf::assemble::DynamicFEDofHandler::GlobalDofIndices(DynamicFEDofHandler *this,Entity *entity)

{
  uint uVar1;
  element_type *peVar2;
  pointer puVar3;
  int iVar4;
  dim_t dVar5;
  uint uVar6;
  span<const_long,_18446744073709551615UL> sVar7;
  
  iVar4 = (*entity->_vptr_Entity[4])(entity);
  dVar5 = base::internal::DimensionImpl((RefElType)iVar4);
  peVar2 = (this->mesh_p_).super___shared_ptr<const_lf::mesh::Mesh,_(__gnu_cxx::_Lock_policy)2>.
           _M_ptr;
  uVar6 = (*peVar2->_vptr_Mesh[5])(peVar2,entity);
  puVar3 = (this->offsets_)._M_elems[2 - dVar5].
           super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
           super__Vector_impl_data._M_start;
  uVar1 = puVar3[uVar6];
  sVar7._M_extent._M_extent_value._0_4_ = puVar3[uVar6 + 1] - uVar1;
  sVar7._M_ptr = (this->dofs_)._M_elems[2 - dVar5].super__Vector_base<long,_std::allocator<long>_>.
                 _M_impl.super__Vector_impl_data._M_start + uVar1;
  sVar7._M_extent._M_extent_value._4_4_ = 0;
  return sVar7;
}

Assistant:

std::span<const gdof_idx_t> DynamicFEDofHandler::GlobalDofIndices(
    const lf::mesh::Entity &entity) const {
  // Topological type
  const lf::base::RefEl ref_el_type = entity.RefEl();
  // Co-dimension of entity in a 2D mesh
  const dim_t codim = 2 - ref_el_type.Dimension();
  // Index of current mesh entity
  const glb_idx_t entity_index = mesh_p_->Index(entity);
  // Offset of dof indices for current entity
  const size_type idx_offset = offsets_[codim][entity_index];
  // Number of shape functions covering current entity
  const size_type no_covered_dofs =
      offsets_[codim][entity_index + 1] - idx_offset;
  // Pointers to range of dof indices
  const gdof_idx_t *begin = dofs_[codim].data() + idx_offset;
  const gdof_idx_t *end = begin + no_covered_dofs;
  return {begin, end};
}